

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  sysbvm_tuple_t sVar1;
  undefined1 local_60 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_bd70bc17 gcFrame;
  sysbvm_tuple_t environment_local;
  sysbvm_tuple_t astNode_local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)environment;
  memset(local_60,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_60);
  sVar1 = sysbvm_tuple_getType(context,astNode);
  gcFrame.astNode = sysbvm_type_getAstNodeValidationWithAnalysisAndEvaluationFunction(context,sVar1)
  ;
  if (gcFrame.astNode == 0) {
    sVar1 = sysbvm_tuple_getType(context,astNode);
    gcFrame.astNode = sysbvm_type_getAstNodeAnalysisAndEvaluationFunction(context,sVar1);
    if (gcFrame.astNode == 0) {
      sysbvm_error("Cannot validate, analyze and evaluate non AST node tuple.");
    }
  }
  sVar1 = sysbvm_function_applyNoCheck2
                    (context,gcFrame.astNode,astNode,(sysbvm_tuple_t)gcFrameRecord.roots);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_60);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_validateThenAnalyzeAndEvaluateASTWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_tuple_t environment;
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t function;
        sysbvm_tuple_t result;
    } gcFrame = {
        .environment = environment,
        .astNode = astNode,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.function = sysbvm_type_getAstNodeValidationWithAnalysisAndEvaluationFunction(context, sysbvm_tuple_getType(context, gcFrame.astNode));
    if(!gcFrame.function)
    {
        gcFrame.function = sysbvm_type_getAstNodeAnalysisAndEvaluationFunction(context, sysbvm_tuple_getType(context, gcFrame.astNode));
        if(!gcFrame.function)
            sysbvm_error("Cannot validate, analyze and evaluate non AST node tuple.");
    }

    gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.function, gcFrame.astNode, gcFrame.environment);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}